

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void __thiscall AnonADIOSFile::~AnonADIOSFile(AnonADIOSFile *this)

{
  long in_RDI;
  string local_28 [40];
  
  adios2::core::Engine::Close((int)*(undefined8 *)(in_RDI + 8));
  std::__cxx11::string::string(local_28,(string *)(in_RDI + 0x20));
  adios2::core::ADIOS::RemoveIO(adios,local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string((string *)(in_RDI + 0x40));
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  return;
}

Assistant:

~AnonADIOSFile()
    {
        m_engine->Close();
        adios.RemoveIO(m_IOname);
    }